

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::StreamingBufferSizeSetting::SetLocal(ClientContext *context,Value *input)

{
  ClientConfig *pCVar1;
  idx_t iVar2;
  string sStack_38;
  
  pCVar1 = ClientConfig::GetConfig(context);
  Value::ToString_abi_cxx11_(&sStack_38,input);
  iVar2 = DBConfig::ParseMemoryLimit(&sStack_38);
  pCVar1->streaming_buffer_size = iVar2;
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void StreamingBufferSizeSetting::SetLocal(ClientContext &context, const Value &input) {
	auto &config = ClientConfig::GetConfig(context);
	config.streaming_buffer_size = DBConfig::ParseMemoryLimit(input.ToString());
}